

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.hpp
# Opt level: O2

void __thiscall
csv::internals::ThreadSafeDeque<csv::CSVRow>::push_back
          (ThreadSafeDeque<csv::CSVRow> *this,CSVRow *item)

{
  size_type sVar1;
  
  std::mutex::lock(&this->_lock);
  std::deque<csv::CSVRow,_std::allocator<csv::CSVRow>_>::emplace_back<csv::CSVRow>(&this->data,item)
  ;
  sVar1 = std::deque<csv::CSVRow,_std::allocator<csv::CSVRow>_>::size(&this->data);
  if (this->_notify_size <= sVar1) {
    std::condition_variable::notify_all();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->_lock);
  return;
}

Assistant:

void push_back(T&& item) {
                std::lock_guard<std::mutex> lock{ this->_lock };
                this->data.push_back(std::move(item));

                if (this->size() >= _notify_size) {
                    this->_cond.notify_all();
                }
            }